

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_64x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  __m128i *left_00;
  __m128i *top1;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i *top0;
  __m128i *extraout_XMM0_Qb_01;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m128i rep;
  __m128i l;
  int j;
  int i;
  __m128i l16;
  __m128i one;
  __m128i tl16;
  __m128i dh;
  __m128i dl;
  __m128i ch;
  __m128i cl;
  __m128i bh;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i zero;
  __m128i d;
  __m128i c;
  __m128i b;
  __m128i a;
  __m128i *in_stack_fffffffffffffc00;
  __m128i *in_stack_fffffffffffffc08;
  __m128i *in_stack_fffffffffffffc10;
  __m128i *in_stack_fffffffffffffc18;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  int local_3a0;
  int local_39c;
  undefined8 *local_280;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  
  local_280 = in_RDI;
  for (local_3a0 = 0; local_3a0 < 2; local_3a0 = local_3a0 + 1) {
    auVar2 = *(undefined1 (*) [16])(in_RCX + (local_3a0 << 4));
    local_3c8 = 0x8000800080008000;
    uStack_3c0 = 0x8000800080008000;
    for (local_39c = 0; local_39c < 0x10; local_39c = local_39c + 1) {
      auVar1._8_8_ = uStack_3c0;
      auVar1._0_8_ = local_3c8;
      pshufb(auVar2,auVar1);
      paeth_16x1_pred(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                      in_stack_fffffffffffffc00);
      paeth_16x1_pred(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                      in_stack_fffffffffffffc00);
      in_stack_fffffffffffffc18 = left_00;
      paeth_16x1_pred(left_00,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                      in_stack_fffffffffffffc00);
      in_stack_fffffffffffffc08 = top1;
      in_stack_fffffffffffffc10 = top0;
      paeth_16x1_pred(in_stack_fffffffffffffc18,top0,top1,in_stack_fffffffffffffc00);
      *local_280 = extraout_XMM0_Qa;
      local_280[1] = extraout_XMM0_Qb;
      local_280[2] = in_stack_fffffffffffffc18;
      local_280[3] = extraout_XMM0_Qb_00;
      local_280[4] = in_stack_fffffffffffffc08;
      local_280[5] = in_stack_fffffffffffffc10;
      local_280[6] = extraout_XMM0_Qa_00;
      local_280[7] = extraout_XMM0_Qb_01;
      local_280 = (undefined8 *)(in_RSI + (long)local_280);
      local_1a8 = (short)local_3c8;
      sStack_1a6 = (short)((ulong)local_3c8 >> 0x10);
      sStack_1a4 = (short)((ulong)local_3c8 >> 0x20);
      sStack_1a2 = (short)((ulong)local_3c8 >> 0x30);
      sStack_1a0 = (short)uStack_3c0;
      sStack_19e = (short)((ulong)uStack_3c0 >> 0x10);
      sStack_19c = (short)((ulong)uStack_3c0 >> 0x20);
      sStack_19a = (short)((ulong)uStack_3c0 >> 0x30);
      local_3c8 = CONCAT26(sStack_1a2 + 1,
                           CONCAT24(sStack_1a4 + 1,CONCAT22(sStack_1a6 + 1,local_1a8 + 1)));
      uStack_3c0 = CONCAT26(sStack_19a + 1,
                            CONCAT24(sStack_19c + 1,CONCAT22(sStack_19e + 1,sStack_1a0 + 1)));
      in_stack_fffffffffffffc00 = extraout_XMM0_Qb_01;
    }
  }
  return;
}

Assistant:

void aom_paeth_predictor_64x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 2; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
      const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
      const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);
      _mm_store_si128((__m128i *)(dst + 32), r2);
      _mm_store_si128((__m128i *)(dst + 48), r3);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}